

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O2

uint64_t SharpYUVUpdateY_C(uint16_t *ref,uint16_t *src,uint16_t *dst,int len)

{
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = 0;
  }
  uVar2 = 0;
  for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    iVar8 = (uint)ref[uVar7] - (uint)src[uVar7];
    uVar4 = (uint)dst[uVar7] + iVar8;
    uVar5 = 0x3ff;
    if (uVar4 < 0x3ff) {
      uVar5 = uVar4;
    }
    uVar6 = (ulong)uVar5;
    if ((int)uVar4 < 0) {
      uVar6 = 0;
    }
    iVar1 = -iVar8;
    if (0 < iVar8) {
      iVar1 = iVar8;
    }
    dst[uVar7] = (uint16_t)uVar6;
    uVar2 = uVar2 + (ushort)iVar1;
  }
  return uVar2;
}

Assistant:

static uint64_t SharpYUVUpdateY_C(const uint16_t* ref, const uint16_t* src,
                                  uint16_t* dst, int len) {
  uint64_t diff = 0;
  int i;
  for (i = 0; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_y(new_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}